

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

formattible_type __thiscall
booster::locale::basic_format<char>::get(basic_format<char> *this,uint id)

{
  code *pcVar1;
  long lVar2;
  uint uVar3;
  writer_type in_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  formattible_type fVar5;
  formattible_type fVar6;
  
  lVar4 = CONCAT44(in_register_00000034,id);
  uVar3 = (uint)in_RDX;
  if (uVar3 < *(uint *)(lVar4 + 0x128)) {
    if (7 < uVar3) {
      lVar4 = *(long *)(lVar4 + 0x130);
      fVar5.writer_ = (writer_type)((ulong)(uVar3 - 8) * 0x10);
      *(undefined8 *)&this->message_ = *(undefined8 *)(fVar5.writer_ + lVar4);
      (this->message_).c_id_ = *(char_type **)(fVar5.writer_ + lVar4 + 8);
      fVar5.pointer_ = this;
      return fVar5;
    }
    lVar2 = ((ulong)in_RDX & 0xffffffff) * 0x10;
    in_RDX = *(writer_type *)(lVar4 + 0xa8 + lVar2);
    *(writer_type *)&this->message_ = in_RDX;
    pcVar1 = *(code **)(lVar4 + 0xb0 + lVar2);
  }
  else {
    *(undefined8 *)&this->message_ = 0;
    pcVar1 = details::formattible<char>::void_write;
  }
  (this->message_).c_id_ = (char_type *)pcVar1;
  fVar6.writer_ = in_RDX;
  fVar6.pointer_ = this;
  return fVar6;
}

Assistant:

formattible_type get(unsigned id) const
            {
                if(id >= parameters_count_)
                    return formattible_type();
                else if(id >= base_params_)
                    return ext_params_[id - base_params_];
                else
                    return parameters_[id];
            }